

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O1

istream * operator>>(istream *i,Employee *e)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int workDone1;
  int workToDo1;
  int salaryPerHour1;
  int hourWork1;
  string name1;
  string id1;
  Person p;
  Address a;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  undefined1 local_138 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  Address local_90;
  
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_138._0_8_ = local_138 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"");
  paVar1 = &local_198.field_2;
  local_198._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"");
  paVar2 = &local_1b8.field_2;
  local_1b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"");
  Address::Address(&local_90,(string *)local_138,&local_198,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  local_198._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"");
  local_1b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"92*sa11178","");
  Person::Person((Person *)local_138,&local_198,&local_1b8,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter name: ",0xc);
  std::operator>>(i,(string *)&local_178);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter id: ",10);
  std::operator>>(i,(string *)&local_158);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter address: ",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  operator>>(i,&local_90);
  Person::setName((Person *)local_138,&local_178);
  Person::setId((Person *)local_138,&local_158);
  Person::setAddress((Person *)local_138,&local_90);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter hour work: ",0x11)
  ;
  std::istream::operator>>((istream *)i,&local_1bc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter salary per hour: ",0x17);
  std::istream::operator>>((istream *)i,&local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter work to do: ",0x12);
  std::istream::operator>>((istream *)i,&local_1c4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter work done: ",0x11)
  ;
  std::istream::operator>>((istream *)i,&local_1c8);
  e->salaryPerHour = local_1c0;
  e->hourWork = local_1bc;
  e->workDone = local_1c8;
  e->workToDo = local_1c4;
  local_138._0_8_ = &PTR_validate_00121a50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_p != &local_c0) {
    operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_p != &local_100) {
    operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._8_8_ != &local_120) {
    operator_delete((void *)local_138._8_8_,local_120._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.street._M_dataplus._M_p != &local_90.street.field_2) {
    operator_delete(local_90.street._M_dataplus._M_p,
                    local_90.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.city._M_dataplus._M_p != &local_90.city.field_2) {
    operator_delete(local_90.city._M_dataplus._M_p,local_90.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.country._M_dataplus._M_p != &local_90.country.field_2) {
    operator_delete(local_90.country._M_dataplus._M_p,
                    local_90.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  return i;
}

Assistant:

std::istream &operator>>(istream &i, Employee &e) {

    int hourWork1, salaryPerHour1, workToDo1, workDone1;
    string name1, id1;
    Address a("", "", "");
    Person p("", "92*sa11178", a);
    cout << "Enter name: ";
    i >> name1;
    cout << "Enter id: ";
    i >> id1;
    cout << "Enter address: " << endl;
    i >> a;
    p.setName(name1);
    p.setId(id1);
    p.setAddress(a);
    cout << "Enter hour work: ";
    i >> hourWork1;
    cout << "Enter salary per hour: ";
    i >> salaryPerHour1;
    cout << "Enter work to do: ";
    i >> workToDo1;
    cout << "Enter work done: ";
    i >> workDone1;
    e.setSalaryPerHour(salaryPerHour1);
    e.setHourWork(hourWork1);
    e.setWorkDone(workDone1);
    e.setWorkToDo(workToDo1);
    return i;
}